

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O3

void gnuplotio::
     deref_and_print<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<std::pair<double,int>const*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::pair<double,int>>,gnuplotio::ModeBinary>
               (undefined8 stream,long *arg)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  
  lVar1 = *arg;
  if (arg[1] != lVar1) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      deref_and_print<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<std::pair<double,int>const*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::pair<double,int>>,gnuplotio::ModeBinary>
                (stream,lVar1 + lVar3);
      uVar2 = uVar2 + 1;
      lVar1 = *arg;
      lVar3 = lVar3 + 0x10;
    } while (uVar2 < (ulong)(arg[1] - lVar1 >> 4));
  }
  return;
}

Assistant:

void deref_and_print(std::ostream &stream, const VecOfRange<T> &arg, PrintMode) {
    if(PrintMode::is_binfmt && arg.rvec.empty()) throw plotting_empty_container();
    for(size_t i=0; i<arg.rvec.size(); i++) {
        if(i && PrintMode::is_text) stream << " ";
        deref_and_print(stream, arg.rvec[i], PrintMode());
    }
}